

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::GridRenderCase::getAttributeData
          (GridRenderCase *this,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *data)

{
  pointer pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  undefined1 (*pauVar11) [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vector<int,_std::allocator<int>_> cellOrder;
  Random rnd;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar22 [16];
  undefined1 auVar25 [16];
  undefined1 auVar28 [16];
  undefined1 auVar34 [16];
  
  local_28 = 0x3f80000000000000;
  uStack_20 = 0x3f80000000000000;
  local_38 = 0x3f8000003f800000;
  uStack_30 = 0x3f80000000000000;
  iVar8 = *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2
                  + 4);
  std::vector<int,_std::allocator<int>_>::vector
            (&cellOrder,(long)(iVar8 * iVar8),(allocator_type *)&rnd);
  deRandom_init(&rnd.m_rnd,0xde56789);
  uVar6 = (ulong)((long)cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  uVar9 = 0;
  uVar7 = uVar6 & 0xffffffff;
  if ((int)uVar6 < 1) {
    uVar7 = uVar9;
  }
  for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar9] = (int)uVar9;
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (&rnd,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                  cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  iVar8 = *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2
                  + 4);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (data,(long)(iVar8 * iVar8 * 0xc));
  iVar8 = 0xb;
  for (lVar10 = 0;
      lVar10 < (int)((ulong)((long)cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2); lVar10 = lVar10 + 1) {
    iVar2 = *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                            field_2 + 4);
    iVar3 = cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar10] / iVar2;
    iVar4 = cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar10] % iVar2;
    auVar30._4_12_ = in_XMM3._4_12_;
    auVar30._0_4_ = (float)iVar2;
    pauVar11 = (undefined1 (*) [16])&local_38;
    if ((iVar3 + iVar4 & 1U) == 0) {
      pauVar11 = (undefined1 (*) [16])&local_28;
    }
    auVar12._4_4_ = (float)iVar3;
    uVar7 = CONCAT44(auVar12._4_4_,(float)iVar4);
    auVar17._0_8_ = auVar30._0_8_;
    auVar17._8_4_ = in_XMM3._4_4_;
    auVar17._12_4_ = in_XMM3._4_4_;
    auVar16._8_8_ = auVar17._8_8_;
    auVar16._4_4_ = auVar30._0_4_;
    auVar16._0_4_ = auVar30._0_4_;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar7;
    auVar30 = divps(auVar29,auVar16);
    auVar31._0_8_ = auVar30._0_8_;
    auVar31._8_8_ = 0x3f80000000000000;
    *(undefined1 (*) [16])
     (data->super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
     _M_impl.super__Vector_impl_data._M_start[iVar8 + -0xb].m_data = auVar31;
    uVar5 = *(undefined8 *)(*pauVar11 + 8);
    pVVar1 = (data->
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
             _M_impl.super__Vector_impl_data._M_start + (iVar8 + -10);
    *(undefined8 *)pVVar1->m_data = *(undefined8 *)*pauVar11;
    *(undefined8 *)(pVVar1->m_data + 2) = uVar5;
    auVar32._4_12_ = auVar31._4_12_;
    auVar32._0_4_ =
         (float)*(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                                field_2 + 4);
    auVar18._0_8_ = CONCAT44((float)(iVar3 + 1),(float)(iVar4 + 1));
    auVar18._8_4_ = 0x3f800000;
    auVar18._12_4_ = 0x3f800000;
    auVar34._0_8_ = auVar32._0_8_;
    auVar34._8_4_ = auVar30._4_4_;
    auVar34._12_4_ = auVar30._4_4_;
    auVar33._8_8_ = auVar34._8_8_;
    auVar33._4_4_ = auVar32._0_4_;
    auVar33._0_4_ = auVar32._0_4_;
    auVar19._8_4_ = 0x3f800000;
    auVar19._0_8_ = auVar18._0_8_;
    auVar19._12_4_ = 0x3f800000;
    auVar30 = divps(auVar19,auVar33);
    pVVar1 = (data->
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
             _M_impl.super__Vector_impl_data._M_start + (iVar8 + -9);
    *(long *)pVVar1->m_data = auVar30._0_8_;
    pVVar1->m_data[2] = 0.0;
    pVVar1->m_data[3] = 1.0;
    auVar30 = *pauVar11;
    *(undefined1 (*) [16])
     (data->super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
     _M_impl.super__Vector_impl_data._M_start[iVar8 + -8].m_data = auVar30;
    auVar20._4_12_ = auVar30._4_12_;
    auVar20._0_4_ =
         (float)*(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                                field_2 + 4);
    auVar35._4_4_ = (float)(iVar3 + 1);
    auVar35._0_4_ = (float)iVar4;
    auVar35._8_8_ = 0;
    auVar22._0_8_ = auVar20._0_8_;
    auVar22._8_4_ = auVar30._4_4_;
    auVar22._12_4_ = auVar30._4_4_;
    auVar21._8_8_ = auVar22._8_8_;
    auVar21._4_4_ = auVar20._0_4_;
    auVar21._0_4_ = auVar20._0_4_;
    auVar30 = divps(auVar35,auVar21);
    pVVar1 = (data->
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
             _M_impl.super__Vector_impl_data._M_start + (iVar8 + -7);
    *(long *)pVVar1->m_data = auVar30._0_8_;
    pVVar1->m_data[2] = 0.0;
    pVVar1->m_data[3] = 1.0;
    auVar30 = *pauVar11;
    *(undefined1 (*) [16])
     (data->super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
     _M_impl.super__Vector_impl_data._M_start[iVar8 + -6].m_data = auVar30;
    auVar23._4_12_ = auVar30._4_12_;
    auVar23._0_4_ =
         (float)*(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                                field_2 + 4);
    auVar25._0_8_ = auVar23._0_8_;
    auVar25._8_4_ = auVar30._4_4_;
    auVar25._12_4_ = auVar30._4_4_;
    auVar24._8_8_ = auVar25._8_8_;
    auVar24._4_4_ = auVar23._0_4_;
    auVar24._0_4_ = auVar23._0_4_;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar7;
    auVar30 = divps(auVar36,auVar24);
    pVVar1 = (data->
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
             _M_impl.super__Vector_impl_data._M_start + (iVar8 + -5);
    *(long *)pVVar1->m_data = auVar30._0_8_;
    pVVar1->m_data[2] = 0.0;
    pVVar1->m_data[3] = 1.0;
    auVar30 = *pauVar11;
    *(undefined1 (*) [16])
     (data->super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
     _M_impl.super__Vector_impl_data._M_start[iVar8 + -4].m_data = auVar30;
    auVar26._4_12_ = auVar30._4_12_;
    auVar26._0_4_ =
         (float)*(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                                field_2 + 4);
    auVar12._0_4_ = (float)(iVar4 + 1);
    auVar12._8_4_ = 0x3f800000;
    auVar12._12_4_ = 0x3f800000;
    auVar28._0_8_ = auVar26._0_8_;
    auVar28._8_4_ = auVar30._4_4_;
    auVar28._12_4_ = auVar30._4_4_;
    auVar27._8_8_ = auVar28._8_8_;
    auVar27._4_4_ = auVar26._0_4_;
    auVar27._0_4_ = auVar26._0_4_;
    auVar30 = divps(auVar12,auVar27);
    pVVar1 = (data->
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
             _M_impl.super__Vector_impl_data._M_start + (iVar8 + -3);
    *(long *)pVVar1->m_data = auVar30._0_8_;
    pVVar1->m_data[2] = 0.0;
    pVVar1->m_data[3] = 1.0;
    auVar30 = *pauVar11;
    *(undefined1 (*) [16])
     (data->super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
     _M_impl.super__Vector_impl_data._M_start[iVar8 + -2].m_data = auVar30;
    auVar13._4_12_ = auVar30._4_12_;
    auVar13._0_4_ =
         (float)*(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                                field_2 + 4);
    auVar15._0_8_ = auVar13._0_8_;
    auVar15._8_4_ = auVar30._4_4_;
    auVar15._12_4_ = auVar30._4_4_;
    auVar14._8_8_ = auVar15._8_8_;
    auVar14._4_4_ = auVar13._0_4_;
    auVar14._0_4_ = auVar13._0_4_;
    auVar30 = divps(auVar18,auVar14);
    in_XMM3._0_8_ = auVar30._0_8_;
    in_XMM3._8_8_ = 0x3f80000000000000;
    *(undefined1 (*) [16])
     (data->super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
     _M_impl.super__Vector_impl_data._M_start[iVar8 + -1].m_data = in_XMM3;
    uVar5 = *(undefined8 *)(*pauVar11 + 8);
    pVVar1 = (data->
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
             _M_impl.super__Vector_impl_data._M_start + iVar8;
    *(undefined8 *)pVVar1->m_data = *(undefined8 *)*pauVar11;
    *(undefined8 *)(pVVar1->m_data + 2) = uVar5;
    iVar8 = iVar8 + 0xc;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&cellOrder.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void GridRenderCase::getAttributeData (std::vector<tcu::Vec4>& data) const
{
	const tcu::Vec4		green				(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4		yellow				(1.0f, 1.0f, 0.0f, 1.0f);
	std::vector<int>	cellOrder			(m_gridSize * m_gridSize);
	de::Random			rnd					(0xDE56789);

	// generate grid with cells in random order
	for (int ndx = 0; ndx < (int)cellOrder.size(); ++ndx)
		cellOrder[ndx] = ndx;
	rnd.shuffle(cellOrder.begin(), cellOrder.end());

	data.resize(m_gridSize * m_gridSize * 6 * 2);
	for (int ndx = 0; ndx < (int)cellOrder.size(); ++ndx)
	{
		const int			cellNdx		= cellOrder[ndx];
		const int			cellX		= cellNdx % m_gridSize;
		const int			cellY		= cellNdx / m_gridSize;
		const tcu::Vec4&	cellColor	= ((cellX+cellY)%2 == 0) ? (green) : (yellow);

		data[(ndx * 6 + 0) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(cellX+0) / float(m_gridSize), float(cellY+0) / float(m_gridSize), 0.0f, 1.0f);
		data[(ndx * 6 + 0) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = cellColor;
		data[(ndx * 6 + 1) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(cellX+1) / float(m_gridSize), float(cellY+1) / float(m_gridSize), 0.0f, 1.0f);
		data[(ndx * 6 + 1) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = cellColor;
		data[(ndx * 6 + 2) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(cellX+0) / float(m_gridSize), float(cellY+1) / float(m_gridSize), 0.0f, 1.0f);
		data[(ndx * 6 + 2) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = cellColor;
		data[(ndx * 6 + 3) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(cellX+0) / float(m_gridSize), float(cellY+0) / float(m_gridSize), 0.0f, 1.0f);
		data[(ndx * 6 + 3) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = cellColor;
		data[(ndx * 6 + 4) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(cellX+1) / float(m_gridSize), float(cellY+0) / float(m_gridSize), 0.0f, 1.0f);
		data[(ndx * 6 + 4) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = cellColor;
		data[(ndx * 6 + 5) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(cellX+1) / float(m_gridSize), float(cellY+1) / float(m_gridSize), 0.0f, 1.0f);
		data[(ndx * 6 + 5) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = cellColor;
	}
}